

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5278::ktxStreamTest_CanCreateAutoKtxFromCppStream_Test::TestBody
          (ktxStreamTest_CanCreateAutoKtxFromCppStream_Test *this)

{
  Message *message;
  AssertionResult *pAVar1;
  void **value;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_1;
  KtxTexture<ktxTexture> texture;
  AssertionResult local_218;
  AssertionResult gtest_ar_;
  ktx_error_code_e err;
  undefined8 local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  StreambufStream ktxStream;
  AssertionResult gtest_ar;
  undefined1 local_188 [376];
  
  StreambufStream::StreambufStream(&ktxStream,&(this->super_ktxStreamTest)._ktx2Streambuf,_S_in);
  texture._handle = (ktxTexture *)0x0;
  err = ktxTexture_CreateFromStream
                  (ktxStream._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1);
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)&gtest_ar,"err","KTX_SUCCESS",&err,(ktx_error_code_e *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    std::operator<<((ostream *)(CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 0x10),
                    "Failed to create auto-detected KTX from C++ stream: ");
    local_218._0_8_ = ktxErrorString(err);
    message = testing::Message::operator<<((Message *)&gtest_ar_,(char **)&local_218);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_1e0 = 0;
  if (texture._handle == (ktxTexture *)0x0) {
    local_1c8 = "texture";
    local_1d0 = "nullptr";
    local_1d8 = "!=";
    testing::AssertionFailure();
    pAVar1 = testing::AssertionResult::operator<<(&local_218,(char (*) [12])"Expected: (");
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,&local_1c8);
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,&local_1d8);
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,(char (*) [3])0x12d2e5);
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,&local_1d0);
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
    std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar);
    std::ostream::_M_insert<void_const*>(local_188);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar);
    pAVar1 = testing::AssertionResult::operator<<
                       (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar_);
    pAVar1 = testing::AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
    testing::PrintToString<decltype(nullptr)>((string *)&gtest_ar,(testing *)&local_1e0,value);
    pAVar1 = testing::AssertionResult::operator<<
                       (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar);
    testing::AssertionResult::AssertionResult(&gtest_ar_1,pAVar1);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&local_218.message_);
  }
  else {
    testing::AssertionSuccess();
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    std::operator<<((ostream *)(CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 0x10),
                    "Newly-created auto-detected KTX is null");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
    this_00 = &gtest_ar_1.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    this_00 = &gtest_ar_.message_;
    gtest_ar_.success_ = ktxStream._destructed;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (ktxStream._destructed == false) {
      testing::Message::Message((Message *)&local_218);
      std::operator<<((ostream *)(local_218._0_8_ + 0x10),
                      "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"ktxStream.destructed()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x16f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_218);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_218._0_8_ + 8))();
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
  KtxTexture<ktxTexture>::~KtxTexture(&texture);
  StreambufStream::~StreambufStream(&ktxStream);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateAutoKtxFromCppStream)
{
    StreambufStream ktxStream{std::move(_ktx2Streambuf), std::ios::in}; // Or could use the KTx1, no difference
    KtxTexture<ktxTexture> texture;

    KTX_error_code err = ktxTexture_CreateFromStream(ktxStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create auto-detected KTX from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture, nullptr) << "Newly-created auto-detected KTX is null";
    EXPECT_TRUE(ktxStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}